

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O0

void OpenMD::LUSolveLinearSystem<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,int *index,ElemPoinerType x,int size)

{
  int iVar1;
  double *pdVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  RectMatrix<double,_6U,_6U> *in_RDI;
  Real sum;
  int idx;
  int ii;
  int j;
  int i;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  
  local_28 = 0xffffffff;
  for (local_20 = 0; (int)local_20 < in_ECX; local_20 = local_20 + 1) {
    iVar1 = *(int *)(in_RSI + (long)(int)local_20 * 4);
    local_38 = *(double *)(in_RDX + (long)iVar1 * 8);
    *(undefined8 *)(in_RDX + (long)iVar1 * 8) = *(undefined8 *)(in_RDX + (long)(int)local_20 * 8);
    if ((int)local_28 < 0) {
      if ((local_38 != 0.0) || (NAN(local_38))) {
        local_28 = local_20;
      }
    }
    else {
      for (local_24 = local_28; (int)local_24 <= (int)(local_20 - 1); local_24 = local_24 + 1) {
        pdVar2 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_20,local_24);
        local_38 = -*pdVar2 * *(double *)(in_RDX + (long)(int)local_24 * 8) + local_38;
      }
    }
    *(double *)(in_RDX + (long)(int)local_20 * 8) = local_38;
  }
  for (local_20 = in_ECX - 1; -1 < (int)local_20; local_20 = local_20 - 1) {
    local_38 = *(double *)(in_RDX + (long)(int)local_20 * 8);
    local_24 = local_20;
    while (local_24 = local_24 + 1, (int)local_24 < in_ECX) {
      pdVar2 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_20,local_24);
      local_38 = -*pdVar2 * *(double *)(in_RDX + (long)(int)local_24 * 8) + local_38;
    }
    pdVar2 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_20,local_20);
    *(double *)(in_RDX + (long)(int)local_20 * 8) = local_38 / *pdVar2;
  }
  return;
}

Assistant:

void LUSolveLinearSystem(MatrixType& A, int* index,
                           typename MatrixType::ElemPoinerType x, int size) {
    using Real = typename MatrixType::ElemType;

    int i, j, ii, idx;
    Real sum;
    //
    // Proceed with forward and backsubstitution for L and U
    // matrices.  First, forward substitution.
    //
    for (ii = -1, i = 0; i < size; ++i) {
      idx    = index[i];
      sum    = x[idx];
      x[idx] = x[i];

      if (ii >= 0) {
        for (j = ii; j <= (i - 1); ++j) {
          sum -= A(i, j) * x[j];
        }
      } else if (sum != 0.0) {
        ii = i;
      }

      x[i] = sum;
    }
    //
    // Now, back substitution
    //
    for (i = size - 1; i >= 0; i--) {
      sum = x[i];
      for (j = i + 1; j < size; ++j) {
        sum -= A(i, j) * x[j];
      }
      x[i] = sum / A(i, i);
    }
  }